

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

ps_latpath_t * ps_astar_next(ps_astar_t *nbest)

{
  float fVar1;
  int32 w1;
  ps_lattice_t *ppVar2;
  ps_latnode_t *ppVar3;
  ps_latlink_t *ppVar4;
  ngram_model_t *model;
  ps_latpath_t *newpath;
  ps_latnode_t *ppVar5;
  ps_latpath_s *ppVar6;
  int iVar7;
  ps_latpath_s *ppVar8;
  latlink_list_t *plVar9;
  int32 local_34;
  
  ppVar2 = nbest->dag;
  ppVar8 = nbest->path_list;
  nbest->top = ppVar8;
  if (ppVar8 != (ps_latpath_s *)0x0) {
    do {
      ppVar6 = ppVar8->next;
      nbest->path_list = ppVar6;
      if (ppVar8 == nbest->path_tail) {
        nbest->path_tail = (ps_latpath_t *)0x0;
      }
      nbest->n_path = nbest->n_path + -1;
      ppVar5 = ppVar8->node;
      iVar7 = nbest->ef;
      if (iVar7 <= ppVar5->sf) {
        return ppVar8;
      }
      ppVar3 = ppVar2->end;
      if ((ppVar5 == ppVar3) && (ppVar3->sf < iVar7)) {
        return ppVar8;
      }
      if ((ppVar5->fef < iVar7) && (plVar9 = ppVar5->exits, plVar9 != (latlink_list_t *)0x0)) {
        do {
          if (-0x20000000 < (plVar9->link->to->info).fanin) {
            newpath = (ps_latpath_t *)
                      __listelem_malloc__(nbest->latpath_alloc,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                          ,0x68a);
            ppVar4 = plVar9->link;
            ppVar5 = ppVar4->to;
            newpath->node = ppVar5;
            newpath->parent = ppVar8;
            iVar7 = ppVar4->ascr + ppVar8->score;
            newpath->score = iVar7;
            model = nbest->lmset;
            if (model != (ngram_model_t *)0x0) {
              fVar1 = (float)nbest->lwf;
              w1 = ppVar8->node->basewid;
              if (ppVar8->parent == (ps_latpath_s *)0x0) {
                iVar7 = ngram_bg_score(model,ppVar5->basewid,w1,&local_34);
              }
              else {
                iVar7 = ngram_tg_score(model,ppVar5->basewid,w1,ppVar8->parent->node->basewid,
                                       &local_34);
              }
              iVar7 = (int)((float)newpath->score + fVar1 * (float)(iVar7 >> 10));
              newpath->score = iVar7;
              ppVar5 = newpath->node;
            }
            nbest->n_hyp_tried = nbest->n_hyp_tried + 1;
            iVar7 = iVar7 + (ppVar5->info).fanin;
            if ((nbest->n_path < 500) ||
               ((nbest->path_tail->node->info).fanin + nbest->path_tail->score <= iVar7)) {
              path_insert(nbest,newpath,iVar7);
            }
            else {
              __listelem_free__(nbest->latpath_alloc,newpath,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                ,0x6a7);
              nbest->n_hyp_reject = nbest->n_hyp_reject + 1;
            }
          }
          plVar9 = plVar9->next;
        } while (plVar9 != (latlink_list_s *)0x0);
        ppVar6 = nbest->path_list;
      }
      nbest->top = ppVar6;
      ppVar8 = ppVar6;
    } while (ppVar6 != (ps_latpath_s *)0x0);
  }
  return (ps_latpath_t *)0x0;
}

Assistant:

ps_latpath_t *
ps_astar_next(ps_astar_t *nbest)
{
    ps_lattice_t *dag;

    dag = nbest->dag;

    /* Pop the top (best) partial hypothesis */
    while ((nbest->top = nbest->path_list) != NULL) {
        nbest->path_list = nbest->path_list->next;
        if (nbest->top == nbest->path_tail)
            nbest->path_tail = NULL;
        nbest->n_path--;

        /* Complete hypothesis? */
        if ((nbest->top->node->sf >= nbest->ef)
            || ((nbest->top->node == dag->end) &&
                (nbest->ef > dag->end->sf))) {
            /* FIXME: Verify that it is non-empty.  Also we may want
             * to verify that it is actually distinct from other
             * paths, since often this is not the case*/
            return nbest->top;
        }
        else {
            if (nbest->top->node->fef < nbest->ef)
                path_extend(nbest, nbest->top);
        }
    }

    /* Did not find any more paths to extend. */
    return NULL;
}